

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::FormatA<unsigned_long>
          (anon_unknown_0 *this,HexFloatTypeParams float_traits,unsigned_long mantissa,int exp,
          bool uppercase,FormatState *state)

{
  string_view data_postfix;
  string_view data;
  char *trailing_zeros_00;
  size_t state_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined7 in_register_00000089;
  int *exp_00;
  HexFloatTypeParams float_traits_00;
  int32_t local_110;
  undefined1 local_10b;
  char local_109;
  undefined1 local_f9;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  size_t local_e8;
  char *local_e0;
  char local_d8;
  undefined1 local_d7;
  char acStack_d6 [6];
  char exp_buffer [34];
  size_t kBufSizeForExpDecRepr;
  string_view digits_result;
  size_t trailing_zeros;
  size_t digits_emitted;
  char *digits;
  char *digits_iter;
  char digits_buffer [20];
  size_t kBufSizeForHexFloatRepr;
  byte local_42;
  byte local_41;
  uint8_t leading;
  undefined8 uStack_40;
  bool precision_specified;
  size_t kTotalNibbles;
  size_t kIntBits;
  FormatState *state_local;
  bool uppercase_local;
  unsigned_long uStack_20;
  int exp_local;
  unsigned_long mantissa_local;
  HexFloatTypeParams float_traits_local;
  
  exp_00 = (int *)CONCAT71(in_register_00000089,uppercase);
  uStack_20 = float_traits.leading_digit_size_bits;
  float_traits_local._0_8_ = float_traits._0_8_;
  mantissa_local._0_4_ = (uint)this;
  state_local._4_4_ = (int)mantissa;
  state_local._3_1_ = (byte)exp & 1;
  kTotalNibbles = 0x40;
  uStack_40 = 0x10;
  kIntBits = (size_t)exp_00;
  iVar3 = FormatConversionSpecImpl::precision(*(FormatConversionSpecImpl **)(exp_00 + 4));
  local_41 = -1 < iVar3;
  state_local._4_4_ = state_local._4_4_ + 0x40;
  local_42 = 0;
  float_traits_00.leading_digit_size_bits = (size_t)&local_42;
  float_traits_00.min_exponent = float_traits_local.min_exponent;
  float_traits_00._4_4_ = float_traits_local._4_4_;
  FormatANormalize<unsigned_long>
            ((anon_unknown_0 *)(ulong)(uint)mantissa_local,float_traits_00,
             (uint8_t *)&stack0xffffffffffffffe0,(unsigned_long *)((long)&state_local + 4),exp_00);
  FormatARound<unsigned_long>
            ((bool)(local_41 & 1),(FormatState *)kIntBits,&local_42,&stack0xffffffffffffffe0,
             (int *)((long)&state_local + 4));
  stack0xffffffffffffffa0 = 0x14;
  iVar3 = 0x10;
  if ((state_local._3_1_ & 1) != 0) {
    iVar3 = 0;
  }
  digits_iter._0_1_ = 0x30;
  local_f9 = 0x58;
  if ((state_local._3_1_ & 1) == 0) {
    local_f9 = 0x78;
  }
  digits_iter._1_1_ = local_f9;
  digits_iter._2_1_ = "0123456789ABCDEF0123456789abcdef"[(ulong)local_42 + (long)iVar3];
  digits = (char *)((long)&digits_iter + 3);
  if (((((local_41 & 1) != 0) && (*(long *)(kIntBits + 8) != 0)) ||
      (((local_41 & 1) == 0 && (uStack_20 != 0)))) ||
     (bVar1 = FormatConversionSpecImpl::has_alt_flag
                        (*(FormatConversionSpecImpl **)(kIntBits + 0x10)), bVar1)) {
    digits = (char *)((long)&digits_iter + 4);
    digits_iter._3_1_ = 0x2e;
  }
  trailing_zeros = 0;
  for (; uStack_20 != 0; uStack_20 = uStack_20 << 4) {
    bVar2 = GetNibble<unsigned_long>(uStack_20,0xf);
    *digits = "0123456789ABCDEF0123456789abcdef"[(ulong)bVar2 + (long)iVar3];
    trailing_zeros = trailing_zeros + 1;
    digits = digits + 1;
  }
  digits_result._M_str = (char *)0x0;
  if ((local_41 & 1) != 0) {
    if (*(ulong *)(kIntBits + 8) < trailing_zeros) {
      __assert_fail("state.precision >= digits_emitted",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                    ,0x3a5,
                    "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = unsigned long]"
                   );
    }
    digits_result._M_str = (char *)(*(long *)(kIntBits + 8) - trailing_zeros);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&kBufSizeForExpDecRepr,
             (char *)&digits_iter,(long)digits - (long)&digits_iter);
  stack0xffffffffffffff50 = 0x22;
  local_109 = 'P';
  if ((state_local._3_1_ & 1) == 0) {
    local_109 = 'p';
  }
  local_d8 = local_109;
  local_10b = 0x2b;
  if (state_local._4_4_ < 0) {
    local_10b = 0x2d;
  }
  local_d7 = local_10b;
  if (state_local._4_4_ < 0) {
    local_110 = -state_local._4_4_;
  }
  else {
    local_110 = state_local._4_4_;
  }
  numbers_internal::FastIntToBuffer(local_110,acStack_d6);
  state_00 = kIntBits;
  trailing_zeros_00 = digits_result._M_str;
  local_e8 = kBufSizeForExpDecRepr;
  local_e0 = (char *)digits_result._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,&local_d8);
  data._M_str = local_e0;
  data._M_len = local_e8;
  data_postfix._M_str = local_f8._M_str;
  data_postfix._M_len = local_f8._M_len;
  FinalPrint((FormatState *)state_00,data,2,(size_t)trailing_zeros_00,data_postfix);
  return;
}

Assistant:

void FormatA(const HexFloatTypeParams float_traits, Int mantissa, int exp,
             bool uppercase, const FormatState &state) {
  // Int properties.
  constexpr size_t kIntBits = sizeof(Int) * 8;
  constexpr size_t kTotalNibbles = sizeof(Int) * 8 / 4;
  // Did the user specify a precision explicitly?
  const bool precision_specified = state.conv.precision() >= 0;

  // ========== Normalize/Denormalize ==========
  exp += kIntBits;  // make all digits fractional digits.
  // This holds the (up to four) bits of leading digit, i.e., the '1' in the
  // number 0x1.e6fp+2. It's always > 0 unless number is zero or denormal.
  uint8_t leading = 0;
  FormatANormalize(float_traits, &leading, &mantissa, &exp);

  // =============== Rounding ==================
  // Check if we need to round; if so, then we do that by manipulating
  // (incrementing) the mantissa before beginning to print characters.
  FormatARound(precision_specified, state, &leading, &mantissa, &exp);

  // ============= Format Result ===============
  // This buffer holds the "0x1.ab1de3" portion of "0x1.ab1de3pe+2". Compute the
  // size with long double which is the largest of the floats.
  constexpr size_t kBufSizeForHexFloatRepr =
      2                                                // 0x
      + std::numeric_limits<MaxFloatType>::digits / 4  // number of hex digits
      + 1                                              // round up
      + 1;                                             // "." (dot)
  char digits_buffer[kBufSizeForHexFloatRepr];
  char *digits_iter = digits_buffer;
  const char *const digits =
      static_cast<const char *>("0123456789ABCDEF0123456789abcdef") +
      (uppercase ? 0 : 16);

  // =============== Hex Prefix ================
  *digits_iter++ = '0';
  *digits_iter++ = uppercase ? 'X' : 'x';

  // ========== Non-Fractional Digit ===========
  *digits_iter++ = digits[leading];

  // ================== Dot ====================
  // There are three reasons we might need a dot. Keep in mind that, at this
  // point, the mantissa holds only the fractional part.
  if ((precision_specified && state.precision > 0) ||
      (!precision_specified && mantissa > 0) || state.conv.has_alt_flag()) {
    *digits_iter++ = '.';
  }

  // ============ Fractional Digits ============
  size_t digits_emitted = 0;
  while (mantissa > 0) {
    *digits_iter++ = digits[GetNibble(mantissa, kTotalNibbles - 1)];
    mantissa <<= 4;
    ++digits_emitted;
  }
  size_t trailing_zeros = 0;
  if (precision_specified) {
    assert(state.precision >= digits_emitted);
    trailing_zeros = state.precision - digits_emitted;
  }
  auto digits_result = string_view(
      digits_buffer, static_cast<size_t>(digits_iter - digits_buffer));

  // =============== Exponent ==================
  constexpr size_t kBufSizeForExpDecRepr =
      numbers_internal::kFastToBufferSize  // required for FastIntToBuffer
      + 1                                  // 'p' or 'P'
      + 1;                                 // '+' or '-'
  char exp_buffer[kBufSizeForExpDecRepr];
  exp_buffer[0] = uppercase ? 'P' : 'p';
  exp_buffer[1] = exp >= 0 ? '+' : '-';
  numbers_internal::FastIntToBuffer(exp < 0 ? -exp : exp, exp_buffer + 2);

  // ============ Assemble Result ==============
  FinalPrint(state,
             digits_result,                        // 0xN.NNN...
             2,                                    // offset of any padding
             static_cast<size_t>(trailing_zeros),  // remaining mantissa padding
             exp_buffer);                          // exponent
}